

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this)

{
  cmake *this_00;
  string *psVar1;
  cmAlphaNum local_c0;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string pfile;
  string home;
  cmGlobalGenerator *this_local;
  
  this_00 = GetCMakeInstance(this);
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)(pfile.field_2._M_local_buf + 8),(string *)psVar1);
  cmAlphaNum::cmAlphaNum(&local_80,(string *)(pfile.field_2._M_local_buf + 8));
  cmAlphaNum::cmAlphaNum(&local_c0,"/CMakeFiles/CMakeRuleHashes.txt");
  cmStrCat<>((string *)local_50,&local_80,&local_c0);
  CheckRuleHashes(this,(string *)local_50,(string *)((long)&pfile.field_2 + 8));
  WriteRuleHashes(this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(pfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes()
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string home = this->GetCMakeInstance()->GetHomeOutputDirectory();
  std::string pfile = cmStrCat(home, "/CMakeFiles/CMakeRuleHashes.txt");
  this->CheckRuleHashes(pfile, home);
  this->WriteRuleHashes(pfile);
#endif
}